

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_zmqhub.c
# Opt level: O2

int csp_zmqhub_init(uint16_t addr,char *host,uint32_t flags,csp_iface_t **return_interface)

{
  char pub [100];
  char sub [100];
  
  csp_zmqhub_make_endpoint(host,6000,pub,100);
  csp_zmqhub_make_endpoint(host,7000,sub,100);
  csp_zmqhub_init_w_endpoints(addr,pub,sub,flags,return_interface);
  return 0;
}

Assistant:

int csp_zmqhub_init(uint16_t addr,
					const char * host,
					uint32_t flags,
					csp_iface_t ** return_interface) {

	char pub[100];
	csp_zmqhub_make_endpoint(host, CSP_ZMQPROXY_SUBSCRIBE_PORT, pub, sizeof(pub));

	char sub[100];
	csp_zmqhub_make_endpoint(host, CSP_ZMQPROXY_PUBLISH_PORT, sub, sizeof(sub));

	return csp_zmqhub_init_w_endpoints(addr, pub, sub, flags, return_interface);
}